

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
::initEmpty(DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
            *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  *(undefined8 *)(this + 8) = 0;
  uVar1 = *(uint *)(this + 0x10);
  if ((uVar1 & uVar1 - 1) == 0) {
    lVar2 = *(long *)this;
    for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
      *(undefined8 *)(lVar2 + lVar3) = 0xffffffffffffffff;
    }
    return;
  }
  __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x15c,
                "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>::initEmpty() [DerivedT = llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, KeyT = unsigned long, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseSetPair<unsigned long>]"
               );
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }